

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void Am_Start_Interactor(Am_Object *inter,Am_Object *start_obj,Am_Input_Char start_char,
                        Am_Object *start_window,int start_x,int start_y,bool update_now)

{
  bool bVar1;
  Am_Inter_State AVar2;
  ostream *poVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  int start_y_local;
  int start_x_local;
  Am_Input_Char start_char_local;
  Am_Object local_88;
  Am_Object local_80;
  Am_Input_Event local_78;
  Am_Inter_Internal_Method method;
  
  start_y_local = start_y;
  start_x_local = start_x;
  start_char_local = start_char;
  Am_Object::Am_Object(&local_80,inter);
  AVar2 = Am_Get_Inter_State(&local_80);
  Am_Object::~Am_Object(&local_80);
  if (AVar2 == Am_INTER_WAITING) {
    Am_Object::Am_Object(&local_88,inter);
    if (am_trace_next_inter == true) {
      am_trace_next_inter = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n>> ** Interactor ",0x12);
      poVar3 = operator<<((ostream *)&std::cout,&local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," started.  Starting tracing\n",0x1c);
      std::ostream::flush();
      Am_Object::Am_Object((Am_Object *)&local_78,&local_88);
      Am_Set_Inter_Trace((Am_Object *)&local_78);
      Am_Object::~Am_Object((Am_Object *)&local_78);
    }
    Am_Object::~Am_Object(&local_88);
    bVar1 = Am_Object::Valid(start_obj);
    if (!bVar1) {
      Am_Object::Get_Object((Am_Object *)&local_78,(Am_Slot_Key)inter,10);
      Am_Object::operator=(start_obj,(Am_Object *)&local_78);
      Am_Object::~Am_Object((Am_Object *)&local_78);
    }
    bVar1 = Am_Object::Valid(start_window);
    if ((!bVar1) && (bVar1 = Am_Object::Valid(start_obj), bVar1)) {
      pAVar4 = Am_Object::Get(start_obj,0x68,0);
      Am_Object::operator=(start_window,pAVar4);
      bVar1 = Am_Object::Valid(start_window);
      if ((!bVar1) ||
         (bVar1 = Am_Translate_Coordinates(start_obj,0,0,start_window,&start_x_local,&start_y_local)
         , !bVar1)) {
        pAVar4 = Am_Object::Get(start_obj,100,0);
        start_x_local = Am_Value::operator_cast_to_int(pAVar4);
        pAVar4 = Am_Object::Get(start_obj,0x65,0);
        start_y_local = Am_Value::operator_cast_to_int(pAVar4);
      }
    }
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(start_window);
    Am_Object::Set(inter,0x68,pAVar5,0);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(start_obj);
    Am_Object::Set(inter,0x11a,pAVar5,0);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(start_obj);
    Am_Object::Set(inter,0x119,pAVar5,0);
    Am_Input_Char::operator_cast_to_Am_Value(&start_char_local);
    Am_Object::Set(inter,0x11b,(Am_Value *)&local_78,0);
    Am_Value::~Am_Value((Am_Value *)&local_78);
    Am_Object::Set(inter,0x11f,start_x_local,0);
    Am_Object::Set(inter,0x120,start_y_local,0);
    Am_Input_Char::Am_Input_Char
              (&local_78.input_char,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    local_78.user_id.type = 0;
    local_78.user_id.value.wrapper_value = (Am_Wrapper *)0x0;
    local_78.input_char.code = start_char_local.code;
    local_78.input_char._2_2_ = start_char_local._2_2_ & 0xfff | local_78.input_char._2_2_ & 0xf000;
    local_78.x = start_x_local;
    local_78.y = start_y_local;
    local_78.draw = (Am_Drawonable *)0x0;
    local_78.time_stamp = 0;
    method.from_wrapper = (Am_Method_Wrapper *)0x0;
    method.Call = (Am_Inter_Internal_Method_Type *)0x0;
    pAVar4 = Am_Object::Get(inter,0xbe,0);
    Am_Inter_Internal_Method::operator=(&method,pAVar4);
    (*method.Call)(inter,start_obj,start_window,&local_78);
    if (update_now) {
      Am_Demon_Queue::Invoke(&Main_Demon_Queue);
      Am_Update_All();
    }
    Am_Value::~Am_Value(&local_78.user_id);
    return;
  }
  return;
}

Assistant:

void
Am_Start_Interactor(Am_Object inter, Am_Object start_obj,
                    Am_Input_Char start_char, Am_Object start_window,
                    int start_x, int start_y, bool update_now)
{

  Am_Inter_State state = Am_Get_Inter_State(inter);
  if (state != Am_INTER_WAITING)
    return;

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly Starting " << inter);
  Check_And_Handle_Trace_Next_Inter(inter);
  if (!start_obj.Valid())
    start_obj = inter.Get_Owner();
  if (!start_window.Valid() && start_obj.Valid()) {
    start_window = start_obj.Get(Am_WINDOW);
    if (start_window.Valid() &&
        Am_Translate_Coordinates(start_obj, 0, 0, start_window, start_x,
                                 start_y))
      //then have pos of start_obj in start_window
      ;
    else {
      start_x = start_obj.Get(Am_LEFT);
      start_y = start_obj.Get(Am_TOP);
    }
  }
  //now start the interactor
  inter.Set(Am_WINDOW, start_window);
  inter.Set(Am_START_OBJECT, start_obj);
  inter.Set(Am_CURRENT_OBJECT, start_obj);
  inter.Set(Am_START_CHAR, start_char);
  inter.Set(Am_FIRST_X, start_x);
  inter.Set(Am_FIRST_Y, start_y);
  Am_Input_Event ev;
  ev.input_char = start_char;
  ev.x = start_x;
  ev.y = start_y;
  ev.draw = nullptr;
  ev.time_stamp = 0;
  Am_Inter_Internal_Method method;
  method = inter.Get(Am_INTER_START_METHOD);
  method.Call(inter, start_obj, start_window, &ev);
  if (update_now)
    do_update();
}